

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cpp
# Opt level: O0

Error * ot::commissioner::RestoreDirPath(Error *__return_storage_ptr__,string *aPath)

{
  bool bVar1;
  ErrorCode EVar2;
  ulong uVar3;
  char *__path;
  int *piVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar5;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  char *local_420;
  anon_class_1_0_00000001 local_412;
  v10 local_411;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_410;
  string local_400;
  int local_3dc;
  undefined1 local_3d8 [4];
  int result;
  anon_class_1_0_00000001 local_3aa;
  v10 local_3a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a8;
  char *local_3a0;
  string local_398;
  Error local_378;
  string local_350;
  Error local_330;
  undefined4 local_308;
  anon_class_1_0_00000001 local_302;
  v10 local_301;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_300;
  char *local_2f8;
  string local_2f0;
  undefined1 local_2d0 [8];
  string path;
  undefined1 local_2a0 [8];
  Error error;
  string dirName;
  string baseName;
  string *aPath_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_228 [2];
  undefined1 local_218 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  char *local_200;
  string *local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f0;
  char *pcStack_1e8;
  string *local_1e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1d8 [2];
  undefined1 local_1c8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b8;
  char *local_1b0;
  string *local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  char *pcStack_198;
  string *local_190;
  v10 *local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_180;
  v10 *local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_170;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  local_168;
  undefined1 local_148 [16];
  v10 *local_138;
  char *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  v10 *local_120;
  v10 *local_118;
  char *pcStack_110;
  string *local_108;
  v10 *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_f8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  *local_f0;
  undefined1 *local_e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  *local_e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  *local_d8;
  undefined8 local_d0;
  undefined1 *local_c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_c0;
  undefined1 *local_b8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_b0;
  undefined8 local_a8;
  undefined1 *local_a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_98;
  undefined1 *local_90;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_88;
  undefined8 local_80;
  undefined1 *local_78;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  char *pcStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  char *pcStack_30;
  v10 **local_20;
  v10 *local_18;
  char *pcStack_10;
  
  std::__cxx11::string::string((string *)(dirName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(error.mMessage.field_2._M_local_buf + 8));
  Error::Error((Error *)local_2a0);
  std::__cxx11::string::string((string *)local_2d0,(string *)aPath);
  RemoveTrailings((string *)local_2d0);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::string((string *)&local_350,(string *)local_2d0);
    PathExists(&local_330,&local_350);
    Error::operator=((Error *)local_2a0,&local_330);
    Error::~Error(&local_330);
    std::__cxx11::string::~string((string *)&local_350);
    Error::Error(&local_378);
    bVar1 = Error::operator==((Error *)local_2a0,&local_378);
    Error::~Error(&local_378);
    if (bVar1) {
      Error::Error(__return_storage_ptr__,(Error *)local_2a0);
    }
    else {
      SplitPath((string *)local_2d0,(string *)((long)&error.mMessage.field_2 + 8),
                (string *)((long)&dirName.field_2 + 8));
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        RestoreDirPath((Error *)local_3d8,(string *)((long)&error.mMessage.field_2 + 8));
        Error::operator=((Error *)local_2a0,(Error *)local_3d8);
        Error::~Error((Error *)local_3d8);
        EVar2 = Error::GetCode((Error *)local_2a0);
        if (EVar2 != kNone) {
          EVar2 = Error::GetCode((Error *)local_2a0);
          if (EVar2 != kAlreadyExists) {
            Error::Error(__return_storage_ptr__,(Error *)local_2a0);
            goto LAB_00129fec;
          }
        }
        __path = (char *)std::__cxx11::string::c_str();
        local_3dc = mkdir(__path,0x1f8);
        if (local_3dc == -1) {
          RestoreDirPath::anon_class_1_0_00000001::operator()(&local_412);
          local_f8 = &local_410;
          local_100 = &local_411;
          bVar5 = ::fmt::v10::operator()(local_100);
          local_410._8_8_ = bVar5.size_;
          local_410._M_allocated_capacity = (size_type)bVar5.data_;
          ::fmt::v10::detail::
          check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char_*,_FMT_COMPILE_STRING,_0>
                    ();
          piVar4 = __errno_location();
          local_420 = strerror(*piVar4);
          local_108 = &local_400;
          local_118 = (v10 *)local_410._M_allocated_capacity;
          pcStack_110 = (char *)local_410._8_8_;
          local_120 = (v10 *)local_2d0;
          local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_420;
          local_20 = &local_118;
          local_138 = (v10 *)local_410._M_allocated_capacity;
          local_130 = (char *)local_410._8_8_;
          local_18 = local_138;
          pcStack_10 = local_130;
          ::fmt::v10::
          make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,char*>
                    (&local_168,local_120,local_128,(char **)local_410._M_allocated_capacity);
          local_e8 = local_148;
          local_f0 = &local_168;
          local_d0 = 0xcd;
          fmt_01.size_ = 0xcd;
          fmt_01.data_ = local_130;
          args_01.field_1.values_ = in_R9.values_;
          args_01.desc_ = (unsigned_long_long)local_f0;
          local_e0 = local_f0;
          local_d8 = local_f0;
          local_c8 = local_e8;
          ::fmt::v10::vformat_abi_cxx11_(&local_400,local_138,fmt_01,args_01);
          Error::Error(__return_storage_ptr__,kIOError,&local_400);
          std::__cxx11::string::~string((string *)&local_400);
        }
        else {
          Error::Error(__return_storage_ptr__);
        }
      }
      else {
        RestoreDirPath::anon_class_1_0_00000001::operator()(&local_3aa);
        local_170 = &local_3a8;
        local_178 = &local_3a9;
        bVar5 = ::fmt::v10::operator()(local_178);
        local_3a0 = (char *)bVar5.size_;
        local_3a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar5.data_
        ;
        ::fmt::v10::detail::
        check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                  ();
        local_1e0 = &local_398;
        local_1f0 = local_3a8;
        pcStack_1e8 = local_3a0;
        local_40 = &local_1f0;
        local_208 = local_3a8;
        local_200 = local_3a0;
        local_1f8 = aPath;
        local_38 = local_208;
        pcStack_30 = local_200;
        local_228[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                 ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)aPath,(v10 *)local_1e0,local_3a8);
        local_90 = local_218;
        local_98 = local_228;
        local_80 = 0xd;
        fmt_00.size_ = 0xd;
        fmt_00.data_ = local_200;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_98;
        local_88 = local_98;
        local_78 = local_90;
        local_70 = local_98;
        ::fmt::v10::vformat_abi_cxx11_(&local_398,(v10 *)local_208,fmt_00,args_00);
        Error::Error(__return_storage_ptr__,kRejected,&local_398);
        std::__cxx11::string::~string((string *)&local_398);
      }
    }
  }
  else {
    RestoreDirPath::anon_class_1_0_00000001::operator()(&local_302);
    local_180 = &local_300;
    local_188 = &local_301;
    bVar5 = ::fmt::v10::operator()(local_188);
    local_2f8 = (char *)bVar5.size_;
    local_300 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar5.data_;
    ::fmt::v10::detail::
    check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
              ();
    local_190 = &local_2f0;
    local_1a0 = local_300;
    pcStack_198 = local_2f8;
    local_60 = &local_1a0;
    local_1b8 = local_300;
    local_1b0 = local_2f8;
    local_1a8 = aPath;
    local_58 = local_1b8;
    pcStack_50 = local_1b0;
    local_1d8[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                             ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)aPath,(v10 *)local_190,local_300);
    local_b8 = local_1c8;
    local_c0 = local_1d8;
    local_a8 = 0xd;
    fmt.size_ = 0xd;
    fmt.data_ = local_1b0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_c0;
    local_b0 = local_c0;
    local_a0 = local_b8;
    local_68 = local_c0;
    ::fmt::v10::vformat_abi_cxx11_(&local_2f0,(v10 *)local_1b8,fmt,args);
    Error::Error(__return_storage_ptr__,kAlreadyExists,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
  }
LAB_00129fec:
  local_308 = 1;
  std::__cxx11::string::~string((string *)local_2d0);
  Error::~Error((Error *)local_2a0);
  std::__cxx11::string::~string((string *)(error.mMessage.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(dirName.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

Error RestoreDirPath(const std::string &aPath)
{
    std::string baseName;
    std::string dirName;
    Error       error;

    std::string path = aPath;
    RemoveTrailings(path);

    if (path.empty())
    {
        // Nothing to restore: everything possible is already present in the FS:
        // aPath is either the root directory or relative to the current directory without any named component.
        return ERROR_ALREADY_EXISTS("Nothing to create for {}", aPath);
    }

    // Check path exists
    error = PathExists(path);
    if (error == ERROR_NONE)
    {
        return error;
    }

    SplitPath(path, dirName, baseName);
    if (dirName.empty())
    {
        // (baseName == path) => it is already known the path restoration is impossible (from the caller level)
        return ERROR_REJECTED("Path restoration impossible for path {}", aPath);
    }

    error = RestoreDirPath(dirName);
    if (error.GetCode() != ErrorCode::kNone && error.GetCode() != ErrorCode::kAlreadyExists)
    {
        return error;
    }

    int result = mkdir(path.c_str(), 0770);
    if (result == -1)
    {
        return ERROR_IO_ERROR("Failed to create directory {}: {}", path, strerror(errno));
    }

    return ERROR_NONE;
}